

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseResolver<QList<int>_>::PromiseResolver
          (PromiseResolver<QList<int>_> *this,QPromise<QList<int>_> *promise)

{
  Data *pDVar1;
  QPromise<QList<int>_> *this_00;
  QPromise<QList<int>_> *promise_local;
  PromiseResolver<QList<int>_> *this_local;
  
  pDVar1 = (Data *)operator_new(0x10);
  QSharedData::QSharedData((QSharedData *)pDVar1);
  pDVar1->promise = (QPromise<QList<int>_> *)0x0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>::
  QExplicitlySharedDataPointer(&this->m_d,pDVar1);
  this_00 = (QPromise<QList<int>_> *)operator_new(0x10);
  QtPromise::QPromise<QList<int>_>::QPromise(this_00,promise);
  pDVar1 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>::
           operator->(&this->m_d);
  pDVar1->promise = this_00;
  return;
}

Assistant:

PromiseResolver(QtPromise::QPromise<T> promise) : m_d{new Data{}}
    {
        m_d->promise = new QtPromise::QPromise<T>{std::move(promise)};
    }